

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

tuple<double,_long>
findBestCC(TKeyWaveformF *waveform0,TKeyWaveformF *waveform1,int is0,int is1,int alignWindow)

{
  bool bVar1;
  size_type sVar2;
  __tuple_element_t<0UL,_tuple<double,_double>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<double,_double>_> *p_Var4;
  uint *puVar5;
  vector<std::thread,_std::allocator<std::thread>_> *this;
  int in_ECX;
  undefined8 in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  _Head_base<1UL,_long,_false> in_RDI;
  int in_R8D;
  _Head_base<0UL,_double,_false> extraout_XMM0_Qa;
  tuple<double,_long> tVar6;
  thread *worker_1;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  value_type *worker;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  mutex mutex;
  int nWorkers;
  __tuple_element_t<1UL,_tuple<double,_double>_> sum02;
  __tuple_element_t<0UL,_tuple<double,_double>_> sum0;
  tuple<double,_double> ret;
  int is00;
  TValueCC bestcc;
  TOffset besto;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int iVar7;
  undefined1 *__n;
  undefined8 in_stack_fffffffffffffe90;
  TKeyWaveformF *in_stack_fffffffffffffe98;
  type *__f;
  thread *in_stack_fffffffffffffea0;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_150;
  undefined1 *local_148;
  __tuple_element_t<0UL,_tuple<double,_double>_> local_140;
  __tuple_element_t<1UL,_tuple<double,_double>_> local_138;
  int local_130;
  undefined1 *local_128;
  uint *local_120;
  vector<float,_std::allocator<float>_> *local_118;
  undefined8 local_110;
  int *local_108;
  int *local_100;
  int *local_f8;
  undefined1 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  reference local_d0;
  int local_c8;
  undefined1 local_b1 [25];
  undefined1 local_98 [44];
  uint local_6c [3];
  __tuple_element_t<1UL,_tuple<double,_double>_> local_60;
  __tuple_element_t<0UL,_tuple<double,_double>_> local_58;
  undefined1 local_50 [20];
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_24 [4];
  int local_20;
  int local_1c;
  undefined8 local_18;
  vector<float,_std::allocator<float>_> *local_10;
  
  local_30 = 0xffffffffffffffff;
  local_38 = 0xbff0000000000000;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  local_3c = (int)(sVar2 >> 1) - (local_20 - local_1c) / 2;
  __n = local_50;
  calcSum(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
          (int)in_stack_fffffffffffffe90);
  p_Var3 = std::get<0ul,double,double>((tuple<double,_double> *)0x171352);
  local_58 = *p_Var3;
  p_Var4 = std::get<1ul,double,double>((tuple<double,_double> *)0x171369);
  local_60 = *p_Var4;
  local_6c[1] = 4;
  local_6c[0] = std::thread::hardware_concurrency();
  puVar5 = std::min<unsigned_int>(local_6c + 1,local_6c);
  local_6c[2] = *puVar5;
  std::mutex::mutex((mutex *)0x1713b8);
  this = (vector<std::thread,_std::allocator<std::thread>_> *)(long)(int)local_6c[2];
  __f = (type *)local_b1;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1713d7);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (this,(size_type)__n,(allocator_type *)in_RDI._M_head_impl);
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1713fd);
  local_c8 = 0;
  while( true ) {
    iVar7 = local_c8;
    sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                      ((vector<std::thread,_std::allocator<std::thread>_> *)(local_b1 + 1));
    if ((int)sVar2 <= iVar7) break;
    local_d0 = std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                         ((vector<std::thread,_std::allocator<std::thread>_> *)(local_b1 + 1),
                          (long)local_c8);
    local_140 = local_58;
    local_138 = local_60;
    local_130 = local_c8;
    local_128 = local_24;
    local_120 = local_6c + 2;
    local_118 = local_10;
    local_110 = local_18;
    local_108 = &local_3c;
    local_100 = &local_1c;
    local_f8 = &local_20;
    local_f0 = local_98;
    local_e8 = &local_38;
    local_e0 = &local_30;
    std::thread::
    thread<findBestCC(std::vector<float,std::allocator<float>>const&,std::vector<float,std::allocator<float>>const&,int,int,int)::__0,,void>
              (in_stack_fffffffffffffea0,__f);
    std::thread::operator=
              ((thread *)CONCAT44(iVar7,in_stack_fffffffffffffe70),
               (thread *)in_stack_fffffffffffffe68);
    std::thread::~thread((thread *)0x171545);
    local_c8 = local_c8 + 1;
  }
  local_148 = local_b1 + 1;
  local_150._M_current =
       (thread *)
       std::vector<std::thread,_std::allocator<std::thread>_>::begin(in_stack_fffffffffffffe68);
  std::vector<std::thread,_std::allocator<std::thread>_>::end(in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)CONCAT44(iVar7,in_stack_fffffffffffffe70),
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&local_150);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&local_150);
  }
  std::tuple<double,_long>::tuple<double_&,_long_&,_true>
            ((tuple<double,_long> *)CONCAT44(iVar7,in_stack_fffffffffffffe70),
             (double *)in_stack_fffffffffffffe68,(long *)0x17162a);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_RDI._M_head_impl);
  tVar6.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl =
       extraout_XMM0_Qa._M_head_impl;
  tVar6.super__Tuple_impl<0UL,_double,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)in_RDI._M_head_impl;
  return (tuple<double,_long>)tVar6.super__Tuple_impl<0UL,_double,_long>;
}

Assistant:

std::tuple<TValueCC, TOffset> findBestCC(
    const TKeyWaveformF & waveform0,
    const TKeyWaveformF & waveform1,
    int is0, int is1,
    int alignWindow) {
    TOffset besto = -1;
    TValueCC bestcc = -1.0f;

    int is00 = waveform0.size()/2 - (is1 - is0)/2;
    auto ret = calcSum(waveform0, is00, is00 + is1 - is0);
    auto sum0  = std::get<0>(ret);
    auto sum02 = std::get<1>(ret);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(4, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::min(4u, std::thread::hardware_concurrency());
    std::mutex mutex;
    std::vector<std::thread> workers(nWorkers);
    for (int i = 0; i < (int) workers.size(); ++i) {
        auto & worker = workers[i];
        worker = std::thread([&, sum0 = sum0, sum02 = sum02, i]() {
            TOffset cbesto = -1;
            TValueCC cbestcc = -1.0f;

            for (int o = -alignWindow + i; o <= alignWindow; o += nWorkers) {
                auto cc = calcCC(waveform0, waveform1, sum0, sum02, is00, is0 + o, is1 + o);
                if (cc > cbestcc) {
                    cbesto = o;
                    cbestcc = cc;
                }
            }

            {
                std::lock_guard<std::mutex> lock(mutex);
                if (cbestcc > bestcc) {
                    bestcc = cbestcc;
                    besto = cbesto;
                }
            }
        });
    }
    for (auto & worker : workers) worker.join();
#endif

    return std::tuple<TValueCC, TOffset>(bestcc, besto);
}